

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall SuiteSessionTests::MsgWithBadType::MsgWithBadType(MsgWithBadType *this)

{
  allocator<char> local_91;
  STRING local_90;
  MsgType local_70;
  MsgWithBadType *local_10;
  MsgWithBadType *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"*",&local_91);
  FIX::MsgType::MsgType(&local_70,&local_90);
  FIX42::Message::Message(&this->super_Message,&local_70);
  FIX::MsgType::~MsgType(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  *(undefined ***)&this->super_Message = &PTR__MsgWithBadType_004602a0;
  return;
}

Assistant:

MsgWithBadType() : FIX42::Message( MsgType( "*" ) ) {}